

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrTransformSigs(Vec_Ptr_t *vSig)

{
  Vec_Ptr_t *p;
  char *pcVar1;
  int i;
  
  p = Vec_PtrAllocExact(vSig->nSize);
  for (i = 0; i < vSig->nSize; i = i + 1) {
    pcVar1 = (char *)Vec_PtrEntry(vSig,i);
    pcVar1 = Abc_UtilStrsav(pcVar1);
    Vec_PtrPush(p,pcVar1);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformSigs( Vec_Ptr_t * vSig )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vSig) );
    Vec_PtrForEachEntry( char *, vSig, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    return vNew;
}